

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  u8 *puVar1;
  u8 *puVar2;
  u8 *puVar3;
  char *pcVar4;
  u8 *puVar5;
  ushort uVar6;
  ulong uVar7;
  long lVar8;
  u8 *__dest;
  u8 *__src;
  ulong uVar9;
  
  uVar7 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  lVar8 = (long)(int)pPg->pBt->usableSize;
  puVar1 = puVar2 + lVar8;
  puVar3 = pPg->aCellIdx;
  pcVar4 = pPg->pBt->pPager->pTmpSpace;
  uVar9 = (ulong)(ushort)(*(ushort *)(puVar2 + uVar7 + 5) << 8 |
                         *(ushort *)(puVar2 + uVar7 + 5) >> 8);
  memcpy(pcVar4 + uVar9,puVar2 + uVar9,lVar8 - uVar9);
  __dest = puVar1;
  if (0 < nCell) {
    uVar9 = 0;
    do {
      puVar5 = apCell[uVar9];
      __src = puVar5 + ((long)pcVar4 - (long)puVar2);
      if (puVar1 <= puVar5) {
        __src = puVar5;
      }
      if (puVar5 <= puVar2) {
        __src = puVar5;
      }
      __dest = __dest + -(ulong)szCell[uVar9];
      memcpy(__dest,__src,(ulong)szCell[uVar9]);
      uVar6 = (short)__dest - (short)puVar2;
      *(ushort *)(puVar3 + uVar9 * 2) = uVar6 * 0x100 | uVar6 >> 8;
      uVar9 = uVar9 + 1;
    } while ((uint)nCell != uVar9);
  }
  pPg->nCell = (u16)nCell;
  pPg->nOverflow = '\0';
  (puVar2 + uVar7 + 1)[0] = '\0';
  (puVar2 + uVar7 + 1)[1] = '\0';
  puVar2[uVar7 + 3] = *(u8 *)((long)&pPg->nCell + 1);
  puVar2[uVar7 + 4] = (u8)pPg->nCell;
  puVar2[uVar7 + 5] = (u8)((ulong)((long)__dest - (long)puVar2) >> 8);
  puVar2[uVar7 + 6] = (u8)((long)__dest - (long)puVar2);
  puVar2[uVar7 + 7] = '\0';
  return;
}

Assistant:

static void rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( pCell>aData && pCell<pEnd ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    memcpy(pData, pCell, szCell[i]);
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    assert( szCell[i]==cellSizePtr(pPg, pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
}